

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O1

bool __thiscall
ON_Curve::GetNextDiscontinuity
          (ON_Curve *this,continuity c,double t0,double t1,double *t,int *hint,int *dtype,
          double cos_angle_tolerance,double curvature_tolerance)

{
  ON_3dVector Km;
  ON_3dVector Kp;
  bool bVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  double dVar8;
  ON_Interval domain;
  ON_3dPoint Pb;
  ON_3dVector Kb;
  ON_3dVector Ka;
  ON_3dVector Ta;
  ON_3dVector D2b;
  ON_3dVector D2a;
  ON_3dVector D1b;
  ON_3dVector D1a;
  ON_3dPoint Pa;
  ON_3dVector Tb;
  double local_168;
  ON_Interval local_160;
  double *local_150;
  double local_148;
  uint local_140;
  uint local_13c;
  double local_138;
  double local_130;
  ON_3dPoint local_128;
  ON_3dVector local_108;
  ON_3dVector local_f0;
  ON_3dVector local_d8;
  ON_3dVector local_c0;
  ON_3dVector local_a8;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  if (dtype != (int *)0x0) {
    *dtype = 0;
  }
  if ((t0 == t1) && (!NAN(t0) && !NAN(t1))) {
    return false;
  }
  if (c < Cinfinity_continuous) {
    bVar5 = (byte)c;
    uVar2 = 0x7c0 >> (bVar5 & 0x1f);
    uVar7 = 0x180 >> (bVar5 & 0x1f);
    local_13c = 0x100 >> (bVar5 & 0x1f);
    uVar6 = 0x600 >> (bVar5 & 0x1f);
    local_140 = 0x400 >> (bVar5 & 0x1f);
  }
  else {
    uVar2 = 0;
    uVar7 = 0;
    local_13c = 0;
    uVar6 = 0;
    local_140 = 0;
  }
  if ((uVar2 & 1) == 0) {
    return false;
  }
  dVar8 = t1;
  local_150 = t;
  local_148 = t0;
  local_138 = curvature_tolerance;
  local_130 = cos_angle_tolerance;
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(this);
  iVar3 = 1;
  local_160.m_t[1] = dVar8;
  pdVar4 = ON_Interval::operator[](&local_160,1);
  if ((*pdVar4 <= local_148) || (pdVar4 = ON_Interval::operator[](&local_160,1), t1 < *pdVar4)) {
    iVar3 = 0;
    pdVar4 = ON_Interval::operator[](&local_160,0);
    local_168 = t1;
    if ((*pdVar4 <= local_148 && local_148 != *pdVar4) &&
       (pdVar4 = ON_Interval::operator[](&local_160,0), t1 <= *pdVar4)) goto LAB_00429371;
  }
  else {
LAB_00429371:
    pdVar4 = ON_Interval::operator[](&local_160,iVar3);
    local_168 = *pdVar4;
  }
  pdVar4 = ON_Interval::operator[](&local_160,1);
  if ((*pdVar4 <= local_148) ||
     (pdVar4 = ON_Interval::operator[](&local_160,1), local_168 < *pdVar4)) {
    pdVar4 = ON_Interval::operator[](&local_160,0);
    if (local_148 < *pdVar4 || local_148 == *pdVar4) {
      return false;
    }
    pdVar4 = ON_Interval::operator[](&local_160,0);
    if (*pdVar4 < local_168) {
      return false;
    }
  }
  iVar3 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(this);
  if ((char)iVar3 == '\0') {
    if (dtype != (int *)0x0) {
      *dtype = 0;
    }
    goto LAB_0042958a;
  }
  if ((((byte)uVar7 | (byte)uVar6) & 1) != 0) {
    pdVar4 = ON_Interval::operator[](&local_160,0);
    bVar1 = Ev2Der(this,*pdVar4,&local_60,&local_78,&local_a8,1,(int *)0x0);
    if (!bVar1) {
      return false;
    }
    pdVar4 = ON_Interval::operator[](&local_160,1);
    bVar1 = Ev2Der(this,*pdVar4,&local_128,&local_90,&local_c0,-1,(int *)0x0);
    if (!bVar1) {
      return false;
    }
    local_128.z = local_60.z;
    local_128.x = local_60.x;
    local_128.y = local_60.y;
    if ((uVar7 & 1) == 0) {
      if ((uVar6 & 1) != 0) {
        ON_EvCurvature(&local_78,&local_a8,&local_d8,&local_f0);
        ON_EvCurvature(&local_90,&local_c0,&local_48,&local_108);
        dVar8 = ON_3dVector::operator*(&local_d8,&local_48);
        if (dVar8 < local_130) {
          iVar3 = 1;
        }
        else {
          if ((local_140 & 1) == 0) {
            return false;
          }
          Km.y = local_f0.y;
          Km.x = local_f0.x;
          Km.z = local_f0.z;
          Kp.y = local_108.y;
          Kp.x = local_108.x;
          Kp.z = local_108.z;
          bVar1 = ON_IsG2CurvatureContinuous(Km,Kp,local_130,local_138);
          if (bVar1) {
            return false;
          }
          iVar3 = 2;
        }
        if (dtype != (int *)0x0) {
          *dtype = iVar3;
        }
        goto LAB_0042958a;
      }
    }
    else {
      ON_3dVector::operator-(&local_d8,&local_78,&local_90);
      dVar8 = ON_3dVector::MaximumCoordinate(&local_90);
      bVar1 = ON_3dVector::IsTiny(&local_d8,dVar8 * 1.490116119385e-08);
      if (!bVar1) {
        if (dtype != (int *)0x0) {
          *dtype = 1;
        }
LAB_0042958a:
        *local_150 = local_168;
        return true;
      }
      if ((local_13c & 1) != 0) {
        ON_3dVector::operator-(&local_d8,&local_a8,&local_c0);
        dVar8 = ON_3dVector::MaximumCoordinate(&local_c0);
        bVar1 = ON_3dVector::IsTiny(&local_d8,dVar8 * 1.490116119385e-08);
        if (!bVar1) {
          if (dtype != (int *)0x0) {
            *dtype = 2;
          }
          goto LAB_0042958a;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Curve::GetNextDiscontinuity( 
                ON::continuity c,
                double t0,
                double t1,
                double* t,
                int* hint,
                int* dtype,
                double cos_angle_tolerance,
                double curvature_tolerance
                ) const
{
  // this function must be overridden by curve objects that
  // can have parametric discontinuities on the interior of the curve.

  bool rc = false;

  if ( dtype )
    *dtype = 0;
  
  if ( t0 != t1 )
  {
    bool bTestC0 = false;
    bool bTestD1 = false;
    bool bTestD2 = false;
    bool bTestT = false;
    bool bTestK = false;
    switch(c)
    {
    case ON::continuity::C0_locus_continuous:
      bTestC0 = true;
      break;
    case ON::continuity::C1_locus_continuous:
      bTestC0 = true;
      bTestD1 = true;
      break;
    case ON::continuity::C2_locus_continuous:
      bTestC0 = true;
      bTestD1 = true;
      bTestD2 = true;
      break;
    case ON::continuity::G1_locus_continuous:
      bTestC0 = true;
      bTestT  = true;
      break;
    case ON::continuity::G2_locus_continuous:
      bTestC0 = true;
      bTestT  = true;
      bTestK  = true;
      break;
    default:
      // other values ignored on purpose.
      break;
    }

    if ( bTestC0 )
    {
      // 20 March 2003 Dale Lear:
      //   Have to look for locus discontinuities at ends.
      //   Must test both ends because t0 > t1 is valid input.
      //   In particular, for ON_CurveProxy::GetNextDiscontinuity() 
      //   to work correctly on reversed "real" curves, the 
      //   t0 > t1 must work right.
      ON_Interval domain = Domain();

      if ( t0 < domain[1] && t1 >= domain[1] )
        t1 = domain[1];
      else if ( t0 > domain[0] && t1 <= domain[0] )
        t1 = domain[0];

      if ( (t0 < domain[1] && t1 >= domain[1]) || (t0 > domain[0] && t1 <= domain[0]) )
      {
        if ( IsClosed() )
        {
          if ( bTestD1 || bTestT )
          {
            // need to check locus continuity at start/end of closed curve.
            ON_3dPoint Pa, Pb;
            ON_3dVector D1a, D1b, D2a, D2b;
            if (    Ev2Der(domain[0],Pa,D1a,D2a,1,nullptr) 
                 && Ev2Der(domain[1],Pb,D1b,D2b,-1,nullptr) )
            {
              Pb = Pa; // IsClosed() = true means assume Pa=Pb;
              if ( bTestD1 )
              {
                if ( !(D1a-D1b).IsTiny(D1b.MaximumCoordinate()*ON_SQRT_EPSILON ) )
                {
                  if ( dtype )
                    *dtype = 1;
                  *t = t1;
                  rc = true;
                }
                else if ( bTestD2 && !(D2a-D2b).IsTiny(D2b.MaximumCoordinate()*ON_SQRT_EPSILON) )
                {
                  if ( dtype )
                    *dtype = 2;
                  *t = t1;
                  rc = true;
                }

              }
              else if ( bTestT )
              {
                ON_3dVector Ta, Tb, Ka, Kb;
                ON_EvCurvature( D1a, D2a, Ta, Ka );
                ON_EvCurvature( D1b, D2b, Tb, Kb );
                if ( Ta*Tb < cos_angle_tolerance )
                {
                  if ( dtype )
                    *dtype = 1;
                  *t = t1;
                  rc = true;
                }
                else if ( bTestK )
                {
                  // NOTE: 
                  //  This test must exactly match the one
                  //  used in ON_NurbsCurve::GetNextDiscontinuity()
                  if ( !ON_IsG2CurvatureContinuous( Ka, Kb,
                                                    cos_angle_tolerance,
                                                    curvature_tolerance
                                                    )
                     )
                  {
                    if ( dtype )
                      *dtype = 2;
                    *t = t1;
                    rc = true;
                  }
                }
              }
            }
          }
        }
        else
        {
          // open curves are not locus continuous at ends.
          if (dtype )
            *dtype = 0; // locus C0 discontinuity
          *t = t1;
          rc = true;
        }
      }
    }
  }

  return rc;
}